

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::BatchnormLayerParams::SharedDtor(BatchnormLayerParams *this)

{
  BatchnormLayerParams *pBVar1;
  BatchnormLayerParams *this_local;
  
  pBVar1 = internal_default_instance();
  if ((this != pBVar1) && (this->gamma_ != (WeightParams *)0x0)) {
    (*(this->gamma_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pBVar1 = internal_default_instance();
  if ((this != pBVar1) && (this->beta_ != (WeightParams *)0x0)) {
    (*(this->beta_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pBVar1 = internal_default_instance();
  if ((this != pBVar1) && (this->mean_ != (WeightParams *)0x0)) {
    (*(this->mean_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pBVar1 = internal_default_instance();
  if ((this != pBVar1) && (this->variance_ != (WeightParams *)0x0)) {
    (*(this->variance_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void BatchnormLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete gamma_;
  }
  if (this != internal_default_instance()) {
    delete beta_;
  }
  if (this != internal_default_instance()) {
    delete mean_;
  }
  if (this != internal_default_instance()) {
    delete variance_;
  }
}